

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::updateSingleAabb(cbtCollisionWorld *this,cbtCollisionObject *colObj)

{
  undefined8 uVar1;
  cbtBroadphaseInterface *pcVar2;
  cbtIDebugDraw *pcVar3;
  cbtVector3 cVar4;
  cbtScalar cVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  cbtVector3 maxAabb;
  cbtVector3 minAabb;
  cbtVector3 local_58;
  undefined1 local_48 [16];
  undefined8 local_30;
  float local_28;
  float local_24;
  
  (*colObj->m_collisionShape->_vptr_cbtCollisionShape[2])
            (colObj->m_collisionShape,&colObj->m_worldTransform,&minAabb,&maxAabb);
  if ((((this->m_dispatchInfo).m_useContinuous == true) && (colObj->m_internalType == 2)) &&
     ((colObj->m_collisionFlags & 3) == 0)) {
    local_48 = ZEXT416((uint)gContactBreakingThreshold);
    (*colObj->m_collisionShape->_vptr_cbtCollisionShape[2])
              (colObj->m_collisionShape,&colObj->m_interpolationWorldTransform,&local_58,&local_30);
    cVar4.m_floats = local_58.m_floats;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = local_58.m_floats[0];
    auVar6._4_4_ = local_58.m_floats[1];
    auVar8._4_4_ = local_48._0_4_;
    auVar8._0_4_ = local_48._0_4_;
    auVar8._8_4_ = local_48._0_4_;
    auVar8._12_4_ = local_48._0_4_;
    auVar6 = vsubps_avx(auVar6,auVar8);
    uVar1 = vmovlps_avx(auVar6);
    local_58.m_floats[2] = cVar4.m_floats[2];
    local_58.m_floats[2] = local_58.m_floats[2] - (float)local_48._0_4_;
    local_58.m_floats[3] = cVar4.m_floats[3];
    local_58.m_floats[0] = (cbtScalar)(int)uVar1;
    local_58.m_floats[1] = (cbtScalar)(int)((ulong)uVar1 >> 0x20);
    auVar9._0_4_ = (float)local_48._0_4_ + (float)local_30;
    auVar9._4_4_ = (float)local_48._0_4_ + (float)((ulong)local_30 >> 0x20);
    auVar9._8_4_ = (float)local_48._0_4_ + 0.0;
    auVar9._12_4_ = (float)local_48._0_4_ + 0.0;
    local_30 = vmovlps_avx(auVar9);
    local_28 = (float)local_48._0_4_ + local_28;
    if (auVar6._0_4_ < minAabb.m_floats[0]) {
      minAabb.m_floats[0] = auVar6._0_4_;
    }
    auVar6 = vmovshdup_avx(auVar6);
    if (auVar6._0_4_ < minAabb.m_floats[1]) {
      minAabb.m_floats[1] = auVar6._0_4_;
    }
    if (local_58.m_floats[2] < minAabb.m_floats[2]) {
      minAabb.m_floats[2] = local_58.m_floats[2];
    }
    if (local_58.m_floats[3] < minAabb.m_floats[3]) {
      minAabb.m_floats[3] = local_58.m_floats[3];
    }
    if (maxAabb.m_floats[0] < auVar9._0_4_) {
      maxAabb.m_floats[0] = auVar9._0_4_;
    }
    auVar6 = vmovshdup_avx(auVar9);
    if (maxAabb.m_floats[1] < auVar6._0_4_) {
      maxAabb.m_floats[1] = auVar6._0_4_;
    }
    if (maxAabb.m_floats[2] < local_28) {
      maxAabb.m_floats[2] = local_28;
    }
    if (maxAabb.m_floats[3] < local_24) {
      maxAabb.m_floats[3] = local_24;
    }
  }
  pcVar2 = this->m_broadphasePairCache;
  if ((colObj->m_collisionFlags & 1) == 0) {
    auVar7._4_4_ = maxAabb.m_floats[1];
    auVar7._0_4_ = maxAabb.m_floats[0];
    auVar7._8_8_ = 0;
    auVar10._4_4_ = minAabb.m_floats[1];
    auVar10._0_4_ = minAabb.m_floats[0];
    auVar10._8_8_ = 0;
    auVar6 = vsubps_avx(auVar7,auVar10);
    local_58.m_floats =
         (cbtScalar  [4])
         vinsertps_avx(auVar6,ZEXT416((uint)(maxAabb.m_floats[2] - minAabb.m_floats[2])),0x28);
    cVar5 = cbtVector3::length2(&local_58);
    if (1e+12 <= cVar5) {
      cbtCollisionObject::setActivationState(colObj,5);
      if (updateSingleAabb(cbtCollisionObject*)::reportMe != '\0') {
        return;
      }
      pcVar3 = this->m_debugDrawer;
      if (pcVar3 == (cbtIDebugDraw *)0x0) {
        return;
      }
      updateSingleAabb(cbtCollisionObject*)::reportMe = '\x01';
      (*pcVar3->_vptr_cbtIDebugDraw[0xb])(pcVar3,"Overflow in AABB, object removed from simulation")
      ;
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])
                (this->m_debugDrawer,
                 "If you can reproduce this, please email bugs@continuousphysics.com\n");
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])
                (this->m_debugDrawer,
                 "Please include above information, your Platform, version of OS.\n");
      (*this->m_debugDrawer->_vptr_cbtIDebugDraw[0xb])(this->m_debugDrawer,"Thanks.\n");
      return;
    }
  }
  (*pcVar2->_vptr_cbtBroadphaseInterface[4])
            (pcVar2,colObj->m_broadphaseHandle,&minAabb,&maxAabb,this->m_dispatcher1);
  return;
}

Assistant:

void cbtCollisionWorld::updateSingleAabb(cbtCollisionObject* colObj)
{
	cbtVector3 minAabb, maxAabb;
	colObj->getCollisionShape()->getAabb(colObj->getWorldTransform(), minAabb, maxAabb);
	//need to increase the aabb for contact thresholds
	cbtVector3 contactThreshold(gContactBreakingThreshold, gContactBreakingThreshold, gContactBreakingThreshold);
    /* ***CHRONO*** minAabb and maxAabb not needed because the margin in Chrono also icludes the contact braking layer */
	////minAabb -= contactThreshold;
	////maxAabb += contactThreshold;

	if (getDispatchInfo().m_useContinuous && colObj->getInternalType() == cbtCollisionObject::CO_RIGID_BODY && !colObj->isStaticOrKinematicObject())
	{
		cbtVector3 minAabb2, maxAabb2;
		colObj->getCollisionShape()->getAabb(colObj->getInterpolationWorldTransform(), minAabb2, maxAabb2);
		minAabb2 -= contactThreshold;
		maxAabb2 += contactThreshold;
		minAabb.setMin(minAabb2);
		maxAabb.setMax(maxAabb2);
	}

	cbtBroadphaseInterface* bp = (cbtBroadphaseInterface*)m_broadphasePairCache;

	//moving objects should be moderately sized, probably something wrong if not
	if (colObj->isStaticObject() || ((maxAabb - minAabb).length2() < cbtScalar(1e12)))
	{
		bp->setAabb(colObj->getBroadphaseHandle(), minAabb, maxAabb, m_dispatcher1);
	}
	else
	{
		//something went wrong, investigate
		//this assert is unwanted in 3D modelers (danger of loosing work)
		colObj->setActivationState(DISABLE_SIMULATION);

		static bool reportMe = true;
		if (reportMe && m_debugDrawer)
		{
			reportMe = false;
			m_debugDrawer->reportErrorWarning("Overflow in AABB, object removed from simulation");
			m_debugDrawer->reportErrorWarning("If you can reproduce this, please email bugs@continuousphysics.com\n");
			m_debugDrawer->reportErrorWarning("Please include above information, your Platform, version of OS.\n");
			m_debugDrawer->reportErrorWarning("Thanks.\n");
		}
	}
}